

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

char * little2_skipS(ENCODING *enc,char *ptr)

{
  byte *pbVar1;
  byte *pbVar2;
  uint uVar3;
  
  if (ptr[1] == '\0') {
    while ((uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr), uVar3 < 0x16 &&
           ((0x200600U >> (uVar3 & 0x1f) & 1) != 0))) {
      pbVar1 = (byte *)ptr + 2;
      pbVar2 = (byte *)ptr + 3;
      ptr = (char *)pbVar1;
      if (*pbVar2 != 0) {
        return (char *)pbVar1;
      }
    }
  }
  return (char *)(byte *)ptr;
}

Assistant:

PREFIX(skipS)(const ENCODING *enc, const char *ptr) {
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_LF:
    case BT_CR:
    case BT_S:
      ptr += MINBPC(enc);
      break;
    default:
      return ptr;
    }
  }
}